

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeDumper.cpp
# Opt level: O1

void Js::AsmJsByteCodeDumper::
     DumpWasmMemAccess<Js::OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>>__unaligned>
               (OpCodeAsmJs op,
               OpLayoutT_WasmMemAccess<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> *data,
               FunctionBody *dumpFunction,ByteCodeReader *reader)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  undefined6 in_register_0000003a;
  int iVar4;
  undefined1 local_28 [8];
  WAsmJsMemTag tag;
  
  InitializeWAsmJsMemTag(data->ViewType,(WAsmJsMemTag *)local_28);
  iVar4 = (int)CONCAT62(in_register_0000003a,op);
  if (iVar4 < 0x101) {
    if (iVar4 == 0x5a) {
LAB_007e1e61:
      Output::Print(L" %c%d = %s[I%d + %d]",(ulong)(ushort)local_28._0_2_,(ulong)data->Value,
                    tag._0_8_,(ulong)data->SlotIndex,(ulong)data->Offset);
      return;
    }
    if (iVar4 != 0x5b) {
LAB_007e1eb5:
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/AsmJsByteCodeDumper.cpp"
                                  ,0x24d,"((0))","(0)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      return;
    }
  }
  else if (iVar4 != 0x102) {
    if (iVar4 != 0x101) goto LAB_007e1eb5;
    goto LAB_007e1e61;
  }
  Output::Print(L" %s[I%d + %d] = %c%d",tag._0_8_,(ulong)data->SlotIndex,(ulong)data->Offset,
                (ulong)(ushort)local_28._0_2_,(ulong)data->Value);
  return;
}

Assistant:

void AsmJsByteCodeDumper::DumpWasmMemAccess(OpCodeAsmJs op, const unaligned T * data, FunctionBody * dumpFunction, ByteCodeReader& reader)
    {
        WAsmJsMemTag tag;
        InitializeWAsmJsMemTag(data->ViewType, &tag);
        switch (op)
        {
        case OpCodeAsmJs::LdArrWasm:
        case OpCodeAsmJs::LdArrAtomic:
            Output::Print(_u(" %c%d = %s[I%d + %d]"), tag.valueTag, data->Value, tag.heapTag, data->SlotIndex, data->Offset); break;
        case OpCodeAsmJs::StArrWasm:
        case OpCodeAsmJs::StArrAtomic:
            Output::Print(_u(" %s[I%d + %d] = %c%d"), tag.heapTag, data->SlotIndex, data->Offset, tag.valueTag, data->Value); break;
        default:
            Assume(UNREACHED);
        }
    }